

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O3

FT_UInt32 * tt_cmap14_variants(TT_CMap cmap,FT_Memory memory)

{
  FT_Byte *pFVar1;
  FT_Face pFVar2;
  int iVar3;
  FT_Error FVar4;
  FT_CMap_Class pFVar5;
  ulong uVar6;
  ulong uVar7;
  byte *pbVar8;
  
  pFVar1 = cmap->data;
  pFVar2 = cmap[1].cmap.charmap.face;
  iVar3 = (int)pFVar2;
  FVar4 = tt_cmap14_ensure((TT_CMap14)cmap,iVar3 + 1,memory);
  if (FVar4 == 0) {
    pFVar5 = cmap[1].cmap.clazz;
    if (iVar3 == 0) {
      uVar6 = 0;
    }
    else {
      uVar6 = (ulong)pFVar2 & 0xffffffff;
      pbVar8 = pFVar1 + 10;
      uVar7 = 0;
      do {
        *(uint *)((long)&pFVar5->size + uVar7 * 4) =
             (uint)pbVar8[2] | (uint)pbVar8[1] << 8 | (uint)*pbVar8 << 0x10;
        pbVar8 = pbVar8 + 0xb;
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
    }
    *(FT_UInt32 *)((long)&pFVar5->size + uVar6 * 4) = 0;
  }
  else {
    pFVar5 = (FT_CMap_Class)0x0;
  }
  return (FT_UInt32 *)pFVar5;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32* )
  tt_cmap14_variants( TT_CMap    cmap,
                      FT_Memory  memory )
  {
    TT_CMap14   cmap14 = (TT_CMap14)cmap;
    FT_UInt32   count  = cmap14->num_selectors;
    FT_Byte*    p      = cmap->data + 10;
    FT_UInt32*  result;
    FT_UInt32   i;


    if ( tt_cmap14_ensure( cmap14, ( count + 1 ), memory ) )
      return NULL;

    result = cmap14->results;
    for ( i = 0; i < count; i++ )
    {
      result[i] = (FT_UInt32)TT_NEXT_UINT24( p );
      p        += 8;
    }
    result[i] = 0;

    return result;
  }